

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<int,int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>>
::InsertSlotWithHash<false>::operator()
          (pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
           *__return_storage_ptr__,void *this,int *key,piecewise_construct_t *param_2,
          tuple<const_int_&> *param_3,tuple<const_int_&> *param_4)

{
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this_00;
  unsigned_long i;
  ctrl_t h;
  allocator_type *alloc;
  pair<unsigned_long,_bool> pVar1;
  iterator local_60;
  unsigned_long local_50;
  undefined1 local_48;
  unsigned_long local_40;
  pair<unsigned_long,_bool> res;
  tuple<const_int_&> *param_4_local;
  tuple<const_int_&> *param_3_local;
  piecewise_construct_t *param_2_local;
  int *key_local;
  InsertSlotWithHash<false> *this_local;
  
  res._8_8_ = param_4;
  pVar1 = raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::find_or_prepare_insert<int>(*this,key,**(size_t **)((long)this + 0x10));
  local_50 = pVar1.first;
  local_48 = pVar1.second;
  local_40 = local_50;
  res.first._0_1_ = local_48;
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    alloc = raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
            ::alloc_ref(*this);
    hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,int>,void>::
    transfer<std::allocator<std::pair<int_const,int>>>
              (alloc,(slot_type *)(*(long *)(*this + 8) + local_40 * 8),
               *(slot_type **)((long)this + 8));
    i = local_40;
    this_00 = *this;
    h = H2(**(size_t **)((long)this + 0x10));
    raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::set_ctrl(this_00,i,h);
  }
  local_60 = raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
             ::iterator_at(*this,local_40);
  std::
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool>
  ::
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>::iterator,_bool_&,_true>
            (__return_storage_ptr__,&local_60,(bool *)&res);
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> operator()(const K& key, Args&&...) && {
            auto res = s.find_or_prepare_insert(key, hashval);
            if (res.second) {
                PolicyTraits::transfer(&s.alloc_ref(), s.slots_ + res.first, &slot);
                s.set_ctrl(res.first, H2(hashval));
            } else if (do_destroy) {
                PolicyTraits::destroy(&s.alloc_ref(), &slot);
            }
            return {s.iterator_at(res.first), res.second};
        }